

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

void polar_normal_weights_wrapper<dense_parameters>::func(weight *w,uint64_t index)

{
  uint64_t *in_RSI;
  float *in_RDI;
  float fVar1;
  bool local_11;
  
  do {
    fVar1 = merand48(in_RSI);
    func::x1 = fVar1 + fVar1 + -1.0;
    fVar1 = merand48(in_RSI);
    func::x2 = fVar1 + fVar1 + -1.0;
    func::temp = func::x1 * func::x1 + func::x2 * func::x2;
    local_11 = 1.0 <= func::temp || func::temp == 0.0;
  } while (local_11);
  fVar1 = logf(func::temp);
  func::temp = sqrtf((fVar1 * -2.0) / func::temp);
  *in_RDI = func::x1 * func::temp;
  return;
}

Assistant:

static void func(weight& w, uint64_t index)
  {
    static float x1 = 0.0;
    static float x2 = 0.0;
    static float temp = 0.0;
    do
    {
      x1 = 2.0f * merand48(index) - 1.0f;
      x2 = 2.0f * merand48(index) - 1.0f;
      temp = x1 * x1 + x2 * x2;
    } while ((temp >= 1.0) || (temp == 0.0));
    temp = sqrtf((-2.0f * logf(temp)) / temp);
    w = x1 * temp;
  }